

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# OgreStructs.cpp
# Opt level: O3

string * __thiscall
Assimp::Ogre::VertexElement::SemanticToString_abi_cxx11_
          (string *__return_storage_ptr__,VertexElement *this,Semantic semantic)

{
  char *pcVar1;
  char *pcVar2;
  
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  switch((int)this) {
  case 1:
    pcVar2 = "POSITION";
    pcVar1 = "";
    break;
  case 2:
    pcVar2 = "BLEND_WEIGHTS";
    pcVar1 = "";
    break;
  case 3:
    pcVar2 = "BLEND_INDICES";
    pcVar1 = "";
    break;
  case 4:
    pcVar2 = "NORMAL";
    pcVar1 = "";
    break;
  case 5:
    pcVar2 = "DIFFUSE";
    pcVar1 = "";
    break;
  case 6:
    pcVar2 = "SPECULAR";
    pcVar1 = "";
    break;
  case 7:
    pcVar2 = "TEXTURE_COORDINATES";
    pcVar1 = "";
    break;
  case 8:
    pcVar2 = "BINORMAL";
    pcVar1 = "";
    break;
  case 9:
    pcVar2 = "TANGENT";
    pcVar1 = "";
    break;
  default:
    pcVar2 = "Uknown_VertexElement::Semantic";
    pcVar1 = "";
  }
  std::__cxx11::string::_M_construct<char_const*>((string *)__return_storage_ptr__,pcVar2,pcVar1);
  return __return_storage_ptr__;
}

Assistant:

std::string VertexElement::SemanticToString(Semantic semantic)
{
    switch(semantic)
    {
        case VES_POSITION:              return "POSITION";
        case VES_BLEND_WEIGHTS:         return "BLEND_WEIGHTS";
        case VES_BLEND_INDICES:         return "BLEND_INDICES";
        case VES_NORMAL:                return "NORMAL";
        case VES_DIFFUSE:               return "DIFFUSE";
        case VES_SPECULAR:              return "SPECULAR";
        case VES_TEXTURE_COORDINATES:   return "TEXTURE_COORDINATES";
        case VES_BINORMAL:              return "BINORMAL";
        case VES_TANGENT:               return "TANGENT";
    }
    return "Uknown_VertexElement::Semantic";
}